

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O1

string * __thiscall
rtc::hex_encode_with_delimiter_abi_cxx11_
          (string *__return_storage_ptr__,rtc *this,char *source,size_t srclen,char delimiter)

{
  undefined8 uVar1;
  long lVar2;
  size_t sVar3;
  ostream *poVar4;
  char *buffer;
  undefined8 uStack_1a0;
  FatalMessage local_198;
  
  lVar2 = -((long)source * 3 + 0xfU & 0xfffffffffffffff0);
  buffer = (char *)((long)&local_198 + lVar2);
  *(undefined8 *)((long)&uStack_1a0 + lVar2) = 0x13f142;
  sVar3 = hex_encode_with_delimiter
                    (buffer,(long)source * 3,(char *)this,(size_t)source,(char)srclen);
  if (sVar3 != 0 || source == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(undefined8 *)((long)&uStack_1a0 + lVar2) = 0x13f16a;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,buffer,buffer + sVar3);
    return __return_storage_ptr__;
  }
  *(undefined8 *)((long)&uStack_1a0 + lVar2) = 0x13f193;
  FatalMessage::FatalMessage
            (&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/stringencode.cc"
             ,0x1e3);
  *(undefined8 *)((long)&uStack_1a0 + lVar2) = 0x13f1a7;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Check failed: srclen == 0 || length > 0",0x27);
  uVar1 = *(undefined8 *)(local_198._0_8_ + -0x18);
  *(undefined8 *)((long)&uStack_1a0 + lVar2) = 0x13f1bf;
  std::ios::widen((char)(ostream *)&local_198 + (char)uVar1);
  *(undefined8 *)((long)&uStack_1a0 + lVar2) = 0x13f1ce;
  std::ostream::put((char)&local_198);
  *(undefined8 *)((long)&uStack_1a0 + lVar2) = 0x13f1d6;
  poVar4 = (ostream *)std::ostream::flush();
  *(undefined8 *)((long)&uStack_1a0 + lVar2) = 0x13f1ea;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"# ",2);
  *(code **)((long)&uStack_1a0 + lVar2) = hex_decode;
  FatalMessage::~FatalMessage(&local_198);
}

Assistant:

std::string hex_encode_with_delimiter(const char* source, size_t srclen,
                                      char delimiter) {
  const size_t kBufferSize = srclen * 3;
  char* buffer = STACK_ARRAY(char, kBufferSize);
  size_t length = hex_encode_with_delimiter(buffer, kBufferSize,
                                            source, srclen, delimiter);
  RTC_DCHECK(srclen == 0 || length > 0);
  return std::string(buffer, length);
}